

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_31(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  undefined1 local_9c [28];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  shared_ptr<LNode> then_branch;
  shared_ptr<LNode> condition;
  shared_ptr<LNodeData<LNodeIStmt>_> r;
  LNodeIStmt local_48;
  
  get_node((LParser *)&condition,in_ESI);
  get_node((LParser *)&then_branch,in_ESI);
  local_9c._0_4_ = 0x31;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_9c + 0x14),
             (__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&condition);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_9c + 4),
             (__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&then_branch);
  LNodeIStmt::LNodeIStmt
            (&local_48,(shared_ptr<LNode> *)(local_9c + 0x14),(shared_ptr<LNode> *)(local_9c + 4));
  std::make_shared<LNodeData<LNodeIStmt>,LNodeType,LNodeIStmt>
            ((LNodeType *)&r,(LNodeIStmt *)local_9c);
  LNodeIStmt::~LNodeIStmt(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9c + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  _Var1 = r.super___shared_ptr<LNodeData<LNodeIStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  r.super___shared_ptr<LNodeData<LNodeIStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (LLexer *)r.super___shared_ptr<LNodeData<LNodeIStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  r.super___shared_ptr<LNodeData<LNodeIStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<LNodeData<LNodeIStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&then_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_31() {
    // IStmt : IF Expr Brs THEN Brs NIEStmts END Brs
    auto condition = this->get_node(7);
    auto then_branch = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeIStmt>>(
            LNodeType::IStmt,
            LNodeIStmt(condition, then_branch)
    );
    return r;
}